

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a9020 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a9027._0_1_ = '-';
    uRam00000000001a9027._1_1_ = '-';
    uRam00000000001a9027._2_1_ = '-';
    uRam00000000001a9027._3_1_ = '-';
    uRam00000000001a9027._4_1_ = '-';
    uRam00000000001a9027._5_1_ = '-';
    uRam00000000001a9027._6_1_ = '-';
    uRam00000000001a9027._7_1_ = '-';
    DAT_001a9010 = '-';
    DAT_001a9010_1._0_1_ = '-';
    DAT_001a9010_1._1_1_ = '-';
    DAT_001a9010_1._2_1_ = '-';
    DAT_001a9010_1._3_1_ = '-';
    DAT_001a9010_1._4_1_ = '-';
    DAT_001a9010_1._5_1_ = '-';
    DAT_001a9010_1._6_1_ = '-';
    uRam00000000001a9018 = 0x2d2d2d2d2d2d2d;
    DAT_001a901f = 0x2d;
    DAT_001a9000 = '-';
    DAT_001a9000_1._0_1_ = '-';
    DAT_001a9000_1._1_1_ = '-';
    DAT_001a9000_1._2_1_ = '-';
    DAT_001a9000_1._3_1_ = '-';
    DAT_001a9000_1._4_1_ = '-';
    DAT_001a9000_1._5_1_ = '-';
    DAT_001a9000_1._6_1_ = '-';
    uRam00000000001a9008._0_1_ = '-';
    uRam00000000001a9008._1_1_ = '-';
    uRam00000000001a9008._2_1_ = '-';
    uRam00000000001a9008._3_1_ = '-';
    uRam00000000001a9008._4_1_ = '-';
    uRam00000000001a9008._5_1_ = '-';
    uRam00000000001a9008._6_1_ = '-';
    uRam00000000001a9008._7_1_ = '-';
    DAT_001a8ff0 = '-';
    DAT_001a8ff0_1._0_1_ = '-';
    DAT_001a8ff0_1._1_1_ = '-';
    DAT_001a8ff0_1._2_1_ = '-';
    DAT_001a8ff0_1._3_1_ = '-';
    DAT_001a8ff0_1._4_1_ = '-';
    DAT_001a8ff0_1._5_1_ = '-';
    DAT_001a8ff0_1._6_1_ = '-';
    uRam00000000001a8ff8._0_1_ = '-';
    uRam00000000001a8ff8._1_1_ = '-';
    uRam00000000001a8ff8._2_1_ = '-';
    uRam00000000001a8ff8._3_1_ = '-';
    uRam00000000001a8ff8._4_1_ = '-';
    uRam00000000001a8ff8._5_1_ = '-';
    uRam00000000001a8ff8._6_1_ = '-';
    uRam00000000001a8ff8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a8fe8._0_1_ = '-';
    uRam00000000001a8fe8._1_1_ = '-';
    uRam00000000001a8fe8._2_1_ = '-';
    uRam00000000001a8fe8._3_1_ = '-';
    uRam00000000001a8fe8._4_1_ = '-';
    uRam00000000001a8fe8._5_1_ = '-';
    uRam00000000001a8fe8._6_1_ = '-';
    uRam00000000001a8fe8._7_1_ = '-';
    DAT_001a902f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}